

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::StreamingReporterBase::testGroupEnded(StreamingReporterBase *this,TestGroupStats *param_2)

{
  Option<Catch::GroupInfo> *in_RSI;
  
  Option<Catch::GroupInfo>::reset(in_RSI);
  return;
}

Assistant:

virtual void testGroupEnded( TestGroupStats const& /* _testGroupStats */ ) {
            unusedGroupInfo.reset();
        }